

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

SRes crnlib::LzmaEnc_AllocAndInit
               (CLzmaEnc *p,UInt32 keepWindowSize,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  CMatchFinder *p_00;
  size_t sVar1;
  bool bVar2;
  Byte *pBVar3;
  UInt16 *pUVar4;
  int iVar5;
  UInt32 keepAddBufferBefore;
  SRes SVar6;
  uint uVar7;
  
  iVar5 = 0;
  do {
    if (p->dictSize <= (uint)(1 << ((byte)iVar5 & 0x1f))) goto LAB_0019c8cd;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x1f);
  iVar5 = 0x1f;
LAB_0019c8cd:
  p->distTableSize = iVar5 * 2;
  p->finished = 0;
  p->result = 0;
  if ((p->rc).bufBase == (Byte *)0x0) {
    pBVar3 = (Byte *)(*alloc->Alloc)(alloc,0x10000);
    (p->rc).bufBase = pBVar3;
    if (pBVar3 != (Byte *)0x0) {
      (p->rc).bufLim = pBVar3 + 0x10000;
      goto LAB_0019c915;
    }
  }
  else {
LAB_0019c915:
    uVar7 = p->lp + p->lc;
    if (((p->litProbs == (UInt16 *)0x0) || ((p->saveState).litProbs == (UInt16 *)0x0)) ||
       (p->lclp != uVar7)) {
      (*alloc->Free)(alloc,p->litProbs);
      (*alloc->Free)(alloc,(p->saveState).litProbs);
      p->litProbs = (UInt16 *)0x0;
      (p->saveState).litProbs = (UInt16 *)0x0;
      sVar1 = (long)(0x300 << ((byte)uVar7 & 0x1f)) * 2;
      pUVar4 = (UInt16 *)(*alloc->Alloc)(alloc,sVar1);
      p->litProbs = pUVar4;
      pUVar4 = (UInt16 *)(*alloc->Alloc)(alloc,sVar1);
      (p->saveState).litProbs = pUVar4;
      if (pUVar4 == (UInt16 *)0x0 || p->litProbs == (UInt16 *)0x0) {
        (*alloc->Free)(alloc,p->litProbs);
        (*alloc->Free)(alloc,(p->saveState).litProbs);
        bVar2 = false;
        p->litProbs = (UInt16 *)0x0;
        (p->saveState).litProbs = (UInt16 *)0x0;
        SVar6 = 2;
        goto LAB_0019ca48;
      }
      p->lclp = uVar7;
    }
    p_00 = &p->matchFinderBase;
    uVar7 = p->dictSize;
    (p->matchFinderBase).bigHash = (uint)(0x1000000 < uVar7);
    keepAddBufferBefore = keepWindowSize - uVar7;
    if (keepWindowSize <= uVar7 + 0x1000) {
      keepAddBufferBefore = 0x1000;
    }
    iVar5 = MatchFinder_Create(p_00,uVar7,keepAddBufferBefore,p->numFastBytes,0x111,allocBig);
    SVar6 = 0;
    if (iVar5 != 0) {
      p->matchFinderObj = p_00;
      MatchFinder_CreateVTable(p_00,&p->matchFinder);
      bVar2 = true;
      goto LAB_0019ca48;
    }
  }
  SVar6 = 2;
  bVar2 = false;
LAB_0019ca48:
  if (bVar2) {
    LzmaEnc_Init(p);
    LzmaEnc_InitPrices(p);
    p->nowPos64 = 0;
    SVar6 = 0;
  }
  return SVar6;
}

Assistant:

static SRes LzmaEnc_AllocAndInit(CLzmaEnc* p, UInt32 keepWindowSize, ISzAlloc* alloc, ISzAlloc* allocBig) {
  UInt32 i;
  for (i = 0; i < (UInt32)kDicLogSizeMaxCompress; i++)
    if (p->dictSize <= ((UInt32)1 << i))
      break;
  p->distTableSize = i * 2;

  p->finished = False;
  p->result = SZ_OK;
  RINOK(LzmaEnc_Alloc(p, keepWindowSize, alloc, allocBig));
  LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  p->nowPos64 = 0;
  return SZ_OK;
}